

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall mkvparser::Segment::DoneParsing(Segment *this)

{
  int iVar1;
  longlong stop;
  undefined1 local_28 [4];
  int status;
  longlong avail;
  longlong total;
  Segment *this_local;
  
  if (this->m_size < 0) {
    total = (longlong)this;
    iVar1 = (*this->m_pReader->_vptr_IMkvReader[1])(this->m_pReader,&avail,local_28);
    if (iVar1 < 0) {
      this_local._7_1_ = true;
    }
    else if (avail < 0) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = avail <= this->m_pos;
    }
  }
  else {
    this_local._7_1_ = this->m_start + this->m_size <= this->m_pos;
  }
  return this_local._7_1_;
}

Assistant:

bool Segment::DoneParsing() const {
  if (m_size < 0) {
    long long total, avail;

    const int status = m_pReader->Length(&total, &avail);

    if (status < 0)  // error
      return true;  // must assume done

    if (total < 0)
      return false;  // assume live stream

    return (m_pos >= total);
  }

  const long long stop = m_start + m_size;

  return (m_pos >= stop);
}